

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

void EXPLORE_EVAL::do_actual_learning<false>
               (explore_eval *data,multi_learner *base,multi_ex *ec_seq)

{
  example *peVar1;
  undefined8 *in_RDI;
  cb_class cVar2;
  example **ec_1;
  iterator __end5;
  iterator __begin5;
  multi_ex *__range5;
  float inv_threshold;
  example **ec;
  iterator __end4;
  iterator __begin4;
  multi_ex *__range4;
  example *ec_found;
  float threshold;
  size_t i;
  float action_probability;
  action_scores *a_s;
  example *label_example;
  multi_ex *in_stack_00000660;
  uint32_t in_stack_ffffffffffffffbc;
  multi_ex *in_stack_ffffffffffffffc0;
  multi_ex *in_stack_ffffffffffffffc8;
  multi_learner *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  peVar1 = CB_EXPLORE_ADF::test_adf_sequence(in_stack_00000660);
  if (peVar1 != (example *)0x0) {
    *(label_t *)(in_RDI + 4) = (peVar1->l).multi;
    in_RDI[5] = (peVar1->l).cs.costs._end;
    in_RDI[6] = (peVar1->l).cs.costs.end_array;
    in_RDI[7] = (peVar1->l).cs.costs.erase_count;
    (peVar1->l).multi = *(label_t *)(in_RDI + 8);
    (peVar1->l).cs.costs._end = (wclass *)in_RDI[9];
    (peVar1->l).cs.costs.end_array = (wclass *)in_RDI[10];
    (peVar1->l).cs.costs.erase_count = in_RDI[0xb];
  }
  LEARNER::multiline_learn_or_predict<false>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(uint64_t)in_stack_ffffffffffffffc0
             ,in_stack_ffffffffffffffbc);
  if (peVar1 != (example *)0x0) {
    (peVar1->l).multi = *(label_t *)(in_RDI + 4);
    (peVar1->l).cs.costs._end = (wclass *)in_RDI[5];
    (peVar1->l).cs.costs.end_array = (wclass *)in_RDI[6];
    (peVar1->l).cs.costs.erase_count = in_RDI[7];
  }
  cVar2 = CB_ADF::get_observed_cost(in_stack_ffffffffffffffc0);
  *in_RDI = cVar2._0_8_;
  local_28 = cVar2._8_8_;
  in_RDI[1] = local_28;
  return;
}

Assistant:

void do_actual_learning(explore_eval& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = CB_EXPLORE_ADF::test_adf_sequence(ec_seq);

  if (label_example != nullptr)  // extract label
  {
    data.action_label = label_example->l.cb;
    label_example->l.cb = data.empty_label;
  }
  multiline_learn_or_predict<false>(base, ec_seq, data.offset);

  if (label_example != nullptr)  // restore label
    label_example->l.cb = data.action_label;

  data.known_cost = CB_ADF::get_observed_cost(ec_seq);
  if (label_example != nullptr && is_learn)
  {
    ACTION_SCORE::action_scores& a_s = ec_seq[0]->pred.a_s;

    float action_probability = 0;
    for (size_t i = 0; i < a_s.size(); i++)
      if (data.known_cost.action == a_s[i].action)
        action_probability = a_s[i].score;

    float threshold = action_probability / data.known_cost.probability;

    if (!data.fixed_multiplier)
      data.multiplier = min(data.multiplier, 1 / threshold);
    else
      threshold *= data.multiplier;

    if (threshold > 1. + 1e-6)
      data.violations++;

    if (merand48(data.all->random_state) < threshold)
    {
      example* ec_found = nullptr;
      for (example*& ec : ec_seq)
      {
        if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX && ec->l.cb.costs[0].probability > 0)
          ec_found = ec;
        if (threshold > 1)
          ec->weight *= threshold;
      }
      ec_found->l.cb.costs[0].probability = action_probability;

      multiline_learn_or_predict<true>(base, ec_seq, data.offset);

      if (threshold > 1)
      {
        float inv_threshold = 1.f / threshold;
        for (auto& ec : ec_seq) ec->weight *= inv_threshold;
      }
      ec_found->l.cb.costs[0].probability = data.known_cost.probability;
      data.update_count++;
    }
  }
}